

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O2

bool iutest::UnitTestImpl::ValidateTestPropertyName(string *name)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  char **ppcVar4;
  char *ban [9];
  
  puVar3 = &DAT_001391a0;
  ppcVar4 = ban;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppcVar4 = (char *)*puVar3;
    puVar3 = puVar3 + 1;
    ppcVar4 = ppcVar4 + 1;
  }
  bVar1 = TestProperty::ValidateName<char_const*,9ul>(name,&ban);
  return bVar1;
}

Assistant:

static bool ValidateTestPropertyName(const ::std::string& name)
    {
        const char* ban[] = {
            "name", "tests", "failures", "disabled", "skip", "errors", "time", "timestamp", "random_seed"
        };
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return TestProperty::ValidateName(name, ban);
#else
        return TestProperty::ValidateName(name, ban, ban+IUTEST_PP_COUNTOF(ban));
#endif
    }